

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O3

void __thiscall
CTilesetMapper::Proceed(CTilesetMapper *this,CLayerTiles *pLayer,int ConfigID,RECTi Area)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  CRuleSet *pCVar4;
  CTile *pCVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int *piVar16;
  int iVar17;
  CRule *pCVar18;
  ulong uVar19;
  bool bVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  long in_FS_OFFSET;
  RECTi local_48;
  long local_38;
  
  local_48._8_8_ = Area._8_8_;
  local_48._0_8_ = Area._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < ConfigID) && ((pLayer->super_CLayer).m_Readonly == false)) &&
     (ConfigID < (this->m_aRuleSets).num_elements)) {
    pCVar4 = (this->m_aRuleSets).list;
    if (pCVar4[(uint)ConfigID].m_aRules.num_elements != 0) {
      CLayerTiles::Clamp(pLayer,&local_48);
      if (0 < local_48.h) {
        iVar1 = pLayer->m_Height;
        iVar2 = pLayer->m_Width;
        iVar6 = pCVar4[(uint)ConfigID].m_BaseTile;
        uVar14 = local_48._8_8_ & 0xffffffff;
        iVar23 = local_48.x;
        iVar9 = local_48.x;
        iVar13 = local_48.y;
        iVar15 = local_48.y;
        iVar17 = local_48.h;
        do {
          if (0 < (int)uVar14) {
            do {
              pCVar5 = pLayer->m_pTiles;
              iVar13 = pLayer->m_Width * iVar15 + iVar23;
              if ((pCVar5[iVar13].m_Index != '\0') &&
                 (pCVar5[iVar13].m_Index = (uchar)iVar6,
                 0 < pCVar4[(uint)ConfigID].m_aRules.num_elements)) {
                pCVar18 = pCVar4[(uint)ConfigID].m_aRules.list;
                lVar22 = 0;
                do {
                  uVar14 = (ulong)pCVar18[lVar22].m_aConditions.num_elements;
                  if ((long)uVar14 < 1) {
LAB_0018ec16:
                    if (1 < pCVar18[lVar22].m_Random) {
                      iVar9 = rand();
                      pCVar18 = pCVar4[(uint)ConfigID].m_aRules.list;
                      if ((int)((float)pCVar18[lVar22].m_Random * (float)iVar9 * 4.656613e-10) != 1)
                      goto LAB_0018ecdd;
                    }
                    pCVar5[iVar13].m_Index = (uchar)pCVar18[lVar22].m_Index;
                    pCVar5[iVar13].m_Flags = '\0';
                    iVar9 = pCVar18[lVar22].m_Rotation;
                    bVar11 = 2;
                    if (iVar9 == 0x5a) {
                      bVar12 = 8;
LAB_0018ecaa:
                      pCVar5[iVar13].m_Flags = bVar12;
                    }
                    else {
                      if (iVar9 == 0x10e) {
                        bVar12 = 0xb;
                        goto LAB_0018ecaa;
                      }
                      bVar11 = 1;
                      if (iVar9 == 0xb4) {
                        bVar12 = 3;
                        bVar11 = 1;
                        goto LAB_0018ecaa;
                      }
                      bVar12 = 0;
                    }
                    if (pCVar18[lVar22].m_HFlip != 0) {
                      bVar12 = bVar11 ^ bVar12;
                      pCVar5[iVar13].m_Flags = bVar12;
                    }
                    if (pCVar18[lVar22].m_VFlip != 0) {
                      pCVar5[iVar13].m_Flags = ((bVar12 & 8) == 0) + 1U ^ bVar12;
                    }
                  }
                  else {
                    iVar17 = pLayer->m_Height + -1;
                    iVar9 = pLayer->m_Width + -1;
                    piVar16 = &(pCVar18[lVar22].m_aConditions.list)->m_Value;
                    uVar19 = 1;
                    do {
                      iVar7 = piVar16[-1] + iVar15;
                      iVar21 = iVar17;
                      if (iVar7 < iVar17) {
                        iVar21 = iVar7;
                      }
                      if (iVar7 < 0) {
                        iVar21 = 0;
                      }
                      iVar10 = ((CRuleCondition *)(piVar16 + -2))->m_X + iVar23;
                      iVar7 = iVar9;
                      if (iVar10 < iVar9) {
                        iVar7 = iVar10;
                      }
                      if (iVar10 < 0) {
                        iVar7 = 0;
                      }
                      uVar8 = iVar7 + iVar21 * pLayer->m_Width;
                      if (((int)uVar8 < 0) || (iVar1 * iVar2 <= (int)uVar8)) goto LAB_0018ecdd;
                      uVar3 = *piVar16;
                      uVar8 = (uint)pLayer->m_pTiles[uVar8].m_Index;
                      if (uVar3 < 0xfffffffe) {
                        bVar20 = uVar3 == uVar8;
                      }
                      else {
                        bVar20 = (uVar3 != 0xffffffff || uVar8 != 0) &&
                                 (uVar3 != 0xfffffffe || uVar8 == 0);
                      }
                      if (uVar14 <= uVar19) break;
                      piVar16 = piVar16 + 3;
                      uVar19 = uVar19 + 1;
                    } while (bVar20);
                    if (bVar20) goto LAB_0018ec16;
                  }
LAB_0018ecdd:
                  lVar22 = lVar22 + 1;
                } while (lVar22 < pCVar4[(uint)ConfigID].m_aRules.num_elements);
                uVar14 = local_48._8_8_ & 0xffffffff;
                iVar9 = local_48.x;
              }
              iVar23 = iVar23 + 1;
            } while (iVar23 < (int)uVar14 + iVar9);
            iVar23 = iVar9;
            iVar13 = local_48.y;
            iVar17 = local_48.h;
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 < iVar17 + iVar13);
      }
      (((this->super_IAutoMapper).m_pEditor)->m_Map).m_Modified = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTilesetMapper::Proceed(CLayerTiles *pLayer, int ConfigID, RECTi Area)
{
	if(pLayer->m_Readonly || ConfigID < 0 || ConfigID >= m_aRuleSets.size())
		return;

	CRuleSet *pConf = &m_aRuleSets[ConfigID];

	if(!pConf->m_aRules.size())
		return;

	pLayer->Clamp(&Area);
	
	int BaseTile = pConf->m_BaseTile;

	// auto map !
	int MaxIndex = pLayer->m_Width*pLayer->m_Height;
	for(int y = Area.y; y < Area.y + Area.h; y++)
		for(int x = Area.x; x < Area.x + Area.w; x++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);
			if(pTile->m_Index == 0)
				continue;

			pTile->m_Index = BaseTile;

			for(int i = 0; i < pConf->m_aRules.size(); ++i)
			{
				bool RespectRules = true;
				for(int j = 0; j < pConf->m_aRules[i].m_aConditions.size() && RespectRules; ++j)
				{
					CRuleCondition *pCondition = &pConf->m_aRules[i].m_aConditions[j];
					int CheckIndex = clamp((y+pCondition->m_Y), 0, pLayer->m_Height-1)*pLayer->m_Width+clamp((x+pCondition->m_X), 0, pLayer->m_Width-1);

					if(CheckIndex < 0 || CheckIndex >= MaxIndex)
						RespectRules = false;
					else
					{
 						if(pCondition->m_Value == CRuleCondition::EMPTY || pCondition->m_Value == CRuleCondition::FULL)
						{
							if(pLayer->m_pTiles[CheckIndex].m_Index > 0 && pCondition->m_Value == CRuleCondition::EMPTY)
								RespectRules = false;

							if(pLayer->m_pTiles[CheckIndex].m_Index == 0 && pCondition->m_Value == CRuleCondition::FULL)
								RespectRules = false;
						}
						else
						{
							if(pLayer->m_pTiles[CheckIndex].m_Index != pCondition->m_Value)
								RespectRules = false;
						}
					}
				}

				if(RespectRules && (pConf->m_aRules[i].m_Random <= 1 || (int)(random_float() * pConf->m_aRules[i].m_Random) == 1))
				{
					pTile->m_Index = pConf->m_aRules[i].m_Index;
					pTile->m_Flags = 0;

					// rotate
					if(pConf->m_aRules[i].m_Rotation == 90)
						pTile->m_Flags ^= TILEFLAG_ROTATE;
					else if(pConf->m_aRules[i].m_Rotation == 180)
						pTile->m_Flags ^= (TILEFLAG_HFLIP|TILEFLAG_VFLIP);
					else if(pConf->m_aRules[i].m_Rotation == 270)
						pTile->m_Flags ^= (TILEFLAG_HFLIP|TILEFLAG_VFLIP|TILEFLAG_ROTATE);

					// flip
					if(pConf->m_aRules[i].m_HFlip)
						pTile->m_Flags ^= pTile->m_Flags&TILEFLAG_ROTATE ? TILEFLAG_HFLIP : TILEFLAG_VFLIP;
					if(pConf->m_aRules[i].m_VFlip)
						pTile->m_Flags ^= pTile->m_Flags&TILEFLAG_ROTATE ? TILEFLAG_VFLIP : TILEFLAG_HFLIP;
				}
			}
		}

	m_pEditor->m_Map.m_Modified = true;
}